

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

CSVLine * to_csv_line(CSVLine *__return_storage_ptr__,Repeat *repeat,string *sequence)

{
  value_type local_b8 [32];
  __cxx11 local_98 [32];
  __cxx11 local_78 [32];
  __cxx11 local_58 [55];
  undefined1 local_21;
  string *local_20;
  string *sequence_local;
  Repeat *repeat_local;
  CSVLine *result;
  
  local_21 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = sequence;
  sequence_local = (string *)repeat;
  repeat_local = (Repeat *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,4);
  std::__cxx11::to_string(local_58,*(uint *)sequence_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::to_string(local_78,*(uint *)(sequence_local + 4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::to_string(local_98,*(uint *)(sequence_local + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::substr((ulong)local_b8,(ulong)local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

CSVLine to_csv_line(const tandem::Repeat& repeat, const std::string& sequence)
{
    CSVLine result {};
    result.reserve(4);
    result.push_back(std::to_string(repeat.pos));
    result.push_back(std::to_string(repeat.length));
    result.push_back(std::to_string(repeat.period));
    result.push_back(sequence.substr(repeat.pos, repeat.period));
    return result;
}